

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath1.0.c
# Opt level: O3

LY_ERR lyplg_type_validate_xpath10
                 (ly_ctx *UNUSED_ctx,lysc_type *UNUSED_type,lyd_node *ctx_node,lyd_node *UNUSED_tree
                 ,lyd_value *storage,ly_err_item **err)

{
  lysc_type_bitenum_item *plVar1;
  lysc_node *plVar2;
  long lVar3;
  int iVar4;
  LY_ERR ecode;
  lysc_node **pplVar5;
  char *pcVar6;
  byte *pbVar7;
  undefined8 *object;
  ly_err_item *plVar8;
  lyd_node *plVar9;
  byte *pbVar10;
  char *pcVar11;
  ly_set *plVar12;
  ulong uVar13;
  lys_module *plVar14;
  bool bVar15;
  ly_set *set;
  ly_set *local_50;
  ly_err_item **local_48;
  lysc_type_bitenum_item *local_40;
  lyd_node *local_38;
  
  ecode = LY_SUCCESS;
  local_50 = (ly_set *)0x0;
  *err = (ly_err_item *)0x0;
  plVar1 = (storage->field_2).enum_item;
  if (*(int *)&plVar1->exts == 6) {
    if (plVar1->ref == (char *)0x0) {
      __assert_fail("val->prefix_data",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/xpath1.0.c"
                    ,0x184,
                    "LY_ERR lyplg_type_validate_xpath10(const struct ly_ctx *, const struct lysc_type *, const struct lyd_node *, const struct lyd_node *, struct lyd_value *, struct ly_err_item **)"
                   );
    }
    plVar2 = ctx_node->schema;
    pplVar5 = (lysc_node **)&plVar2->name;
    if (plVar2 == (lysc_node *)0x0) {
      pplVar5 = &ctx_node[1].schema;
    }
    iVar4 = strcmp((char *)*pplVar5,"parent-reference");
    if ((iVar4 != 0) || (iVar4 = strcmp(plVar2->module->name,"ietf-yang-schema-mount"), iVar4 != 0))
    {
      __assert_fail("!strcmp(LYD_NAME(ctx_node), \"parent-reference\") && !strcmp(ctx_node->schema->module->name, \"ietf-yang-schema-mount\")"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/xpath1.0.c"
                    ,0x188,
                    "LY_ERR lyplg_type_validate_xpath10(const struct ly_ctx *, const struct lysc_type *, const struct lyd_node *, const struct lyd_node *, struct lyd_value *, struct ly_err_item **)"
                   );
    }
    ecode = lyd_find_xpath(ctx_node,"../../../namespace",&local_50);
    if (ecode == LY_SUCCESS) {
      plVar12 = local_50;
      local_40 = plVar1;
      local_38 = ctx_node;
      if (local_50->count != 0) {
        uVar13 = 0;
        local_48 = err;
        do {
          plVar9 = (plVar12->field_2).dnodes[uVar13];
          if (plVar9 == (lyd_node *)0x0) {
            iVar4 = strcmp(_DAT_00000040,"prefix");
            if (iVar4 != 0) goto LAB_001bffac;
          }
          else {
            lVar3 = *(long *)(*(long *)(plVar9 + 1) + 8);
            if (lVar3 == 0) {
              iVar4 = strcmp(*(char **)(*(long *)(plVar9 + 1) + 0x40),"prefix");
              if (iVar4 != 0) goto LAB_001bffac;
              if (plVar9 == (lyd_node *)0x0) goto LAB_001bfef6;
            }
            else {
              iVar4 = strcmp(*(char **)(lVar3 + 0x28),"prefix");
              if (iVar4 != 0) {
LAB_001bffac:
                __assert_fail("!strcmp(LYD_NAME(lyd_child(set->dnodes[i])), \"prefix\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/xpath1.0.c"
                              ,400,
                              "LY_ERR lyplg_type_validate_xpath10(const struct ly_ctx *, const struct lysc_type *, const struct lyd_node *, const struct lyd_node *, struct lyd_value *, struct ly_err_item **)"
                             );
              }
            }
            if (((plVar9->schema == (lysc_node *)0x0) || ((plVar9->schema->nodetype & 0x711) != 0))
               && (lVar3 = *(long *)(plVar9 + 1), lVar3 != 0)) {
              pbVar10 = *(byte **)(lVar3 + 8);
              if (pbVar10 == (byte *)0x0) {
                pcVar6 = *(char **)(lVar3 + 0x58);
              }
              else {
                if ((*pbVar10 & 0xc) == 0) goto LAB_001bfde8;
                pcVar6 = *(char **)(lVar3 + 0x38);
                if (pcVar6 == (char *)0x0) {
                  pcVar6 = lyd_value_get_canonical
                                     ((ly_ctx *)**(undefined8 **)(pbVar10 + 8),
                                      (lyd_value *)(lVar3 + 0x38));
                  plVar9 = (local_50->field_2).dnodes[uVar13];
                  plVar12 = local_50;
                  if (plVar9 == (lyd_node *)0x0) goto LAB_001bfef6;
                }
              }
            }
            else {
LAB_001bfde8:
              pcVar6 = (char *)0x0;
            }
            plVar1 = local_40;
            lVar3 = *(long *)(*(long *)(plVar9 + 1) + 0x18);
            if (lVar3 != 0) {
              pbVar10 = *(byte **)(lVar3 + 8);
              bVar15 = pbVar10 == (byte *)0x0;
              if (bVar15) {
                pbVar7 = (byte *)(lVar3 + 0x40);
                pbVar10 = (byte *)0x0;
              }
              else {
                pbVar7 = pbVar10 + 0x28;
              }
              iVar4 = strcmp(*(char **)pbVar7,"uri");
              if (iVar4 != 0) {
                __assert_fail("!strcmp(LYD_NAME(lyd_child(set->dnodes[i])->next), \"uri\")",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/xpath1.0.c"
                              ,0x197,
                              "LY_ERR lyplg_type_validate_xpath10(const struct ly_ctx *, const struct lysc_type *, const struct lyd_node *, const struct lyd_node *, struct lyd_value *, struct ly_err_item **)"
                             );
              }
              if (bVar15) {
                pcVar11 = *(char **)(lVar3 + 0x58);
              }
              else if ((*pbVar10 & 0xc) == 0) {
                pcVar11 = (char *)0x0;
              }
              else {
                pcVar11 = *(char **)(lVar3 + 0x38);
                if (pcVar11 == (char *)0x0) {
                  pcVar11 = lyd_value_get_canonical
                                      ((ly_ctx *)**(undefined8 **)(pbVar10 + 8),
                                       (lyd_value *)(lVar3 + 0x38));
                }
              }
              plVar12 = (ly_set *)plVar1->ref;
              object = (undefined8 *)calloc(1,0x18);
              if (object == (undefined8 *)0x0) {
                ly_set_free(local_50,(_func_void_void_ptr *)0x0);
                err = local_48;
                goto LAB_001bfcd4;
              }
              pcVar6 = strdup(pcVar6);
              *object = pcVar6;
              pcVar11 = strdup(pcVar11);
              object[1] = pcVar11;
              ecode = LY_EMEM;
              if ((pcVar6 != (char *)0x0) && (pcVar11 != (char *)0x0)) {
                *(undefined4 *)(object + 2) = 1;
                ecode = ly_set_add(plVar12,object,'\x01',(uint32_t *)0x0);
                plVar12 = local_50;
                if (ecode == LY_SUCCESS) goto LAB_001bfef6;
                pcVar6 = (char *)*object;
              }
              free(pcVar6);
              free((void *)object[1]);
              free(object);
              err = local_48;
              ctx_node = local_38;
              goto LAB_001bfcbf;
            }
          }
LAB_001bfef6:
          uVar13 = uVar13 + 1;
        } while (uVar13 < plVar12->count);
      }
      ecode = LY_SUCCESS;
      ly_set_free(plVar12,(_func_void_void_ptr *)0x0);
    }
    else {
LAB_001bfcbf:
      ly_set_free(local_50,(_func_void_void_ptr *)0x0);
      if (ecode == LY_EMEM) {
LAB_001bfcd4:
        pcVar11 = "Memory allocation failed.";
        ecode = LY_EMEM;
        pcVar6 = (char *)0x0;
      }
      else {
        if (ctx_node->schema == (lysc_node *)0x0) {
          plVar14 = (lys_module *)&ctx_node[2].schema;
        }
        else {
          plVar14 = ctx_node->schema->module;
        }
        plVar8 = ly_err_last(plVar14->ctx);
        pcVar6 = plVar8->data_path;
        pcVar11 = "%s";
      }
      ly_err_new(err,ecode,LYVE_DATA,pcVar6,(char *)0x0,pcVar11);
    }
  }
  return ecode;
}

Assistant:

static LY_ERR
lyplg_type_validate_xpath10(const struct ly_ctx *UNUSED(ctx), const struct lysc_type *UNUSED(type),
        const struct lyd_node *ctx_node, const struct lyd_node *UNUSED(tree), struct lyd_value *storage,
        struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyd_value_xpath10 *val;
    struct ly_set *set = NULL;
    uint32_t i;
    const char *pref, *uri;
    const struct ly_err_item *eitem;

    *err = NULL;
    LYD_VALUE_GET(storage, val);

    if (val->format != LY_VALUE_STR_NS) {
        /* nothing to validate */
        return LY_SUCCESS;
    }

    /* the XML namespace set must exist */
    assert(val->prefix_data);

    /* special handling of this particular node */
    assert(!strcmp(LYD_NAME(ctx_node), "parent-reference") &&
            !strcmp(ctx_node->schema->module->name, "ietf-yang-schema-mount"));

    /* get all the prefix mappings */
    if ((ret = lyd_find_xpath(ctx_node, "../../../namespace", &set))) {
        goto cleanup;
    }

    for (i = 0; i < set->count; ++i) {
        assert(!strcmp(LYD_NAME(lyd_child(set->dnodes[i])), "prefix"));
        pref = lyd_get_value(lyd_child(set->dnodes[i]));

        if (!lyd_child(set->dnodes[i])->next) {
            /* missing URI - invalid mapping, skip */
            continue;
        }
        assert(!strcmp(LYD_NAME(lyd_child(set->dnodes[i])->next), "uri"));
        uri = lyd_get_value(lyd_child(set->dnodes[i])->next);

        /* new NS */
        if ((ret = xpath10_add_ns(val->prefix_data, pref, uri))) {
            goto cleanup;
        }
    }

cleanup:
    ly_set_free(set, NULL);
    if (ret == LY_EMEM) {
        ly_err_new(err, LY_EMEM, LYVE_DATA, NULL, NULL, LY_EMEM_MSG);
    } else if (ret) {
        eitem = ly_err_last(LYD_CTX(ctx_node));
        ly_err_new(err, ret, LYVE_DATA, eitem->data_path, NULL, "%s", eitem->msg);
    }
    return ret;
}